

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O0

lws_sequencer * lws_seq_create(lws_seq_info_t *i)

{
  int iVar1;
  lws_context_per_thread *plVar2;
  lws_usec_t lVar3;
  lws_seq_t *seq;
  lws_context_per_thread *pt;
  lws_seq_info_t *i_local;
  
  plVar2 = i->context->pt + i->tsi;
  i_local = (lws_seq_info_t *)lws_zalloc(i->user_size + 0xb8,"lws_seq_create");
  if ((lws_seq_t *)i_local == (lws_seq_t *)0x0) {
    i_local = (lws_seq_info_t *)0x0;
  }
  else {
    ((lws_seq_t *)i_local)->cb = i->cb;
    ((lws_seq_t *)i_local)->pt = plVar2;
    ((lws_seq_t *)i_local)->name = i->name;
    ((lws_seq_t *)i_local)->retry = i->retry;
    *i->puser = (lws_seq_t *)((long)i_local + 0xb8);
    lws_dll2_add_tail((lws_dll2 *)i_local,&plVar2->seq_owner);
    lVar3 = lws_now_usecs();
    ((lws_seq_t *)i_local)->time_created = lVar3;
    iVar1 = lws_seq_queue_event((lws_seq_t *)i_local,LWSSEQ_CREATED,(void *)0x0,(void *)0x0);
    if (iVar1 != 0) {
      lws_dll2_remove((lws_dll2 *)i_local);
      lws_realloc(i_local,0,"lws_free");
      i_local = (lws_seq_info_t *)0x0;
    }
  }
  return (lws_sequencer *)i_local;
}

Assistant:

lws_seq_t *
lws_seq_create(lws_seq_info_t *i)
{
	struct lws_context_per_thread *pt = &i->context->pt[i->tsi];
	lws_seq_t *seq = lws_zalloc(sizeof(*seq) + i->user_size, __func__);

	if (!seq)
		return NULL;

	seq->cb = i->cb;
	seq->pt = pt;
	seq->name = i->name;
	seq->retry = i->retry;

	*i->puser = (void *)&seq[1];

	/* add the sequencer to the pt */

	lws_pt_lock(pt, __func__); /* ---------------------------------- pt { */

	lws_dll2_add_tail(&seq->seq_list, &pt->seq_owner);

	lws_pt_unlock(pt); /* } pt ------------------------------------------ */

	seq->time_created = lws_now_usecs();

	/* try to queue the creation cb */

	if (lws_seq_queue_event(seq, LWSSEQ_CREATED, NULL, NULL)) {
		lws_dll2_remove(&seq->seq_list);
		lws_free(seq);

		return NULL;
	}

	return seq;
}